

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  char *pcVar3;
  bool local_1dd;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f3;
  undefined1 local_f2;
  allocator local_f1;
  undefined1 local_f0 [8];
  string compilerId;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string compilerIdVar;
  bool pureFortran;
  cmMakefile *mf_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *compiler;
  
  compilerIdVar.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_48);
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CXX",&local_69);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_48,"CMAKE_CXX_COMPILER_ID");
  }
  else {
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"C",&local_a1);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)local_48,"CMAKE_C_COMPILER_ID");
    }
    else {
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"Fortran",(allocator *)(compilerId.field_2._M_local_buf + 0xf))
      ;
      bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)(compilerId.field_2._M_local_buf + 0xf));
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_48,"CMAKE_Fortran_COMPILER_ID");
        compilerIdVar.field_2._M_local_buf[0xf] = '\x01';
      }
    }
  }
  pcVar3 = cmMakefile::GetSafeDefinition(mf,(string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_f0,pcVar3,&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_f2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gcc",&local_f3);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f0,"MSVC");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"MSVC10",&local_119);
    bVar2 = cmMakefile::IsDefinitionSet(mf,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"msvc10");
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"msvc8");
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_f0,"Borland");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bcc");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f0,"SDCC");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"sdcc");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_f0,"Intel");
        if (bVar2) {
          local_1dd = false;
          if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_140,"WIN32",&local_141);
            local_1dd = cmMakefile::IsDefinitionSet(mf,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator((allocator<char> *)&local_141);
          }
          if (local_1dd == false) {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,"icc");
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ifcwin");
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f0,"Watcom");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f0,"OpenWatcom"), bVar2)) {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ow");
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_f0,"Clang");
            if (bVar2) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clang");
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f0,"PGI");
              if (bVar2) {
                if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) == 0) {
                  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pgi");
                }
                else {
                  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pgifortran");
                }
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_f0,"GNU");
                if (bVar2) {
                  if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) == 0) {
                    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gcc");
                  }
                  else {
                    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gfortran");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_f2 = 1;
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}